

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O3

void __thiscall
barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::remaining_homology_is_trivial
          (barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this)

{
  char cVar1;
  ostream *poVar2;
  
  cVar1 = (char)this + '\b';
  std::ios::widen((char)*(undefined8 *)
                         (*(long *)&(this->
                                    super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                                    ).outstream + -0x18) + cVar1);
  std::ostream::put(cVar1);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"The remaining homology groups are trivial.",0x2a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void remaining_homology_is_trivial() {
		file_output_t<Complex>::outstream << std::endl << "The remaining homology groups are trivial." << std::endl;
	}